

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginViewportSideBar
               (char *name,ImGuiViewport *viewport_p,ImGuiDir dir,float axis_size,
               ImGuiWindowFlags window_flags)

{
  bool bVar1;
  uint uVar2;
  float *pfVar3;
  uint in_ECX;
  int in_EDX;
  ImGuiViewportP *in_RSI;
  float in_XMM0_Da;
  float fVar4;
  ImVec2 IVar5;
  bool is_open;
  ImVec2 size;
  ImVec2 pos;
  ImGuiAxis axis;
  ImRect avail_rect;
  ImGuiViewportP *viewport;
  ImGuiWindow *bar_window;
  ImGuiWindowFlags in_stack_00000384;
  bool *in_stack_00000388;
  char *in_stack_00000390;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined8 in_stack_ffffffffffffff90;
  int count;
  float in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa4;
  float in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  float in_stack_ffffffffffffffb4;
  ImRect local_40;
  ImGuiViewportP *local_30;
  ImGuiWindow *local_28;
  uint local_1c;
  float local_18;
  int local_14;
  ImGuiViewportP *local_10;
  
  count = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  local_1c = in_ECX;
  local_18 = in_XMM0_Da;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_28 = FindWindowByName((char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
  ;
  if ((local_28 == (ImGuiWindow *)0x0) || (local_28->BeginCount == 0)) {
    if (local_10 == (ImGuiViewportP *)0x0) {
      local_10 = (ImGuiViewportP *)GetMainViewport();
    }
    local_30 = local_10;
    local_40 = ImGuiViewportP::GetBuildWorkRect(local_10);
    count = (int)((ulong)local_10 >> 0x20);
    uVar2 = (uint)(local_14 == 2 || local_14 == 3);
    in_stack_ffffffffffffffb4 = local_40.Min.x;
    if ((local_14 == 1) || (local_14 == 3)) {
      pfVar3 = ImVec2::operator[](&local_40.Max,(long)(int)uVar2);
      fVar4 = *pfVar3 - local_18;
      pfVar3 = ImVec2::operator[]((ImVec2 *)&stack0xffffffffffffffb4,(long)(int)uVar2);
      *pfVar3 = fVar4;
    }
    IVar5 = ImRect::GetSize((ImRect *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))
    ;
    in_stack_ffffffffffffffac = IVar5.x;
    fVar4 = local_18;
    pfVar3 = ImVec2::operator[]((ImVec2 *)&stack0xffffffffffffffac,(long)(int)uVar2);
    *pfVar3 = fVar4;
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa4,0.0,0.0);
    SetNextWindowPos((ImVec2 *)&stack0xffffffffffffffb4,0,(ImVec2 *)&stack0xffffffffffffffa4);
    SetNextWindowSize((ImVec2 *)&stack0xffffffffffffffac,0);
    if ((local_14 == 2) || (local_14 == 0)) {
      pfVar3 = ImVec2::operator[](&local_30->BuildWorkOffsetMin,(long)(int)uVar2);
      *pfVar3 = local_18 + *pfVar3;
    }
    else if ((local_14 == 3) || (local_14 == 1)) {
      pfVar3 = ImVec2::operator[](&local_30->BuildWorkOffsetMax,(long)(int)uVar2);
      *pfVar3 = *pfVar3 - local_18;
    }
  }
  local_1c = local_1c | 7;
  PushStyleVar((ImGuiStyleVar)in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff9c,0.0,0.0);
  PushStyleVar((ImGuiStyleVar)in_stack_ffffffffffffffb4,
               (ImVec2 *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  bVar1 = Begin(in_stack_00000390,in_stack_00000388,in_stack_00000384);
  PopStyleVar(count);
  return bVar1;
}

Assistant:

bool ImGui::BeginViewportSideBar(const char* name, ImGuiViewport* viewport_p, ImGuiDir dir, float axis_size, ImGuiWindowFlags window_flags)
{
    IM_ASSERT(dir != ImGuiDir_None);

    ImGuiWindow* bar_window = FindWindowByName(name);
    if (bar_window == NULL || bar_window->BeginCount == 0)
    {
        // Calculate and set window size/position
        ImGuiViewportP* viewport = (ImGuiViewportP*)(void*)(viewport_p ? viewport_p : GetMainViewport());
        ImRect avail_rect = viewport->GetBuildWorkRect();
        ImGuiAxis axis = (dir == ImGuiDir_Up || dir == ImGuiDir_Down) ? ImGuiAxis_Y : ImGuiAxis_X;
        ImVec2 pos = avail_rect.Min;
        if (dir == ImGuiDir_Right || dir == ImGuiDir_Down)
            pos[axis] = avail_rect.Max[axis] - axis_size;
        ImVec2 size = avail_rect.GetSize();
        size[axis] = axis_size;
        SetNextWindowPos(pos);
        SetNextWindowSize(size);

        // Report our size into work area (for next frame) using actual window size
        if (dir == ImGuiDir_Up || dir == ImGuiDir_Left)
            viewport->BuildWorkOffsetMin[axis] += axis_size;
        else if (dir == ImGuiDir_Down || dir == ImGuiDir_Right)
            viewport->BuildWorkOffsetMax[axis] -= axis_size;
    }

    window_flags |= ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove;
    PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowMinSize, ImVec2(0, 0)); // Lift normal size constraint
    bool is_open = Begin(name, NULL, window_flags);
    PopStyleVar(2);

    return is_open;
}